

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

void __thiscall
despot::FullChainBelief::FullChainBelief
          (FullChainBelief *this,DSPOMDP *model,int num_mdp_states,int num_mdp_actions,double alpha)

{
  reference pvVar1;
  size_type __n;
  reference this_00;
  allocator<double> local_59;
  vector<double,_std::allocator<double>_> local_58;
  int local_3c;
  int local_38;
  int a;
  int s;
  double local_28;
  double alpha_local;
  int num_mdp_actions_local;
  int num_mdp_states_local;
  DSPOMDP *model_local;
  FullChainBelief *this_local;
  
  local_28 = alpha;
  alpha_local._0_4_ = num_mdp_actions;
  alpha_local._4_4_ = num_mdp_states;
  _num_mdp_actions_local = model;
  model_local = (DSPOMDP *)this;
  despot::Belief::Belief(&this->super_Belief,model);
  *(undefined ***)this = &PTR__FullChainBelief_0012aa50;
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::vector(&this->alpha_);
  this->cur_state_ = 0;
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize(&this->alpha_,(long)alpha_local._4_4_);
  for (local_38 = 0; local_38 < alpha_local._4_4_; local_38 = local_38 + 1) {
    pvVar1 = std::
             vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ::operator[](&this->alpha_,(long)local_38);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(pvVar1,(long)alpha_local._0_4_);
    for (local_3c = 0; local_3c < alpha_local._0_4_; local_3c = local_3c + 1) {
      __n = (size_type)alpha_local._4_4_;
      std::allocator<double>::allocator(&local_59);
      std::vector<double,_std::allocator<double>_>::vector(&local_58,__n,&local_28,&local_59);
      pvVar1 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[](&this->alpha_,(long)local_38);
      this_00 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](pvVar1,(long)local_3c);
      std::vector<double,_std::allocator<double>_>::operator=(this_00,&local_58);
      std::vector<double,_std::allocator<double>_>::~vector(&local_58);
      std::allocator<double>::~allocator(&local_59);
    }
  }
  return;
}

Assistant:

FullChainBelief::FullChainBelief(const DSPOMDP* model, int num_mdp_states,
	int num_mdp_actions, double alpha) :
	Belief(model),
	cur_state_(0) {
	alpha_.resize(num_mdp_states);
	for (int s = 0; s < num_mdp_states; s++) {
		alpha_[s].resize(num_mdp_actions);
		for (int a = 0; a < num_mdp_actions; a++) {
			alpha_[s][a] = vector<double>(num_mdp_states, alpha);
		}
	}
}